

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  char *__s;
  int iVar1;
  time_t tVar2;
  size_t sVar3;
  Curl_llist_node *n;
  stsentry *e;
  long lVar4;
  ulong max;
  stsentry *psVar5;
  ulong local_40;
  
  if (h != (hsts *)0x0) {
    tVar2 = time((time_t *)0x0);
    sVar3 = strlen(hostname);
    if (0xff < sVar3 - 1) {
      return (stsentry *)0x0;
    }
    max = sVar3 - 1;
    if (hostname[sVar3 - 1] != '.') {
      max = sVar3;
    }
    n = Curl_llist_head(&h->list);
    if (n != (Curl_llist_node *)0x0) {
      psVar5 = (stsentry *)0x0;
      local_40 = 0;
      do {
        e = (stsentry *)Curl_node_elem(n);
        n = Curl_node_next(n);
        if (tVar2 < e->expires) {
          __s = e->host;
          sVar3 = strlen(__s);
          if ((((subdomain) && (e->includeSubDomains == true)) &&
              (lVar4 = max - sVar3, sVar3 <= max && lVar4 != 0)) &&
             ((hostname[lVar4 + -1] == '.' &&
              (iVar1 = curl_strnequal(hostname + lVar4,__s,sVar3), iVar1 != 0 && local_40 < sVar3)))
             ) {
            psVar5 = e;
            local_40 = sVar3;
          }
          if ((max == sVar3) && (iVar1 = curl_strnequal(hostname,e->host,max), iVar1 != 0)) {
            return e;
          }
        }
        else {
          Curl_node_remove((Curl_llist_node *)e);
          (*Curl_cfree)(e->host);
          (*Curl_cfree)(e);
        }
        if (n == (Curl_llist_node *)0x0) {
          return psVar5;
        }
      } while( true );
    }
  }
  return (stsentry *)0x0;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  struct stsentry *bestsub = NULL;
  if(h) {
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    size_t blen = 0;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;

    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      size_t ntail;
      n = Curl_node_next(e);
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_node_remove(&sts->node);
        hsts_free(sts);
        continue;
      }
      ntail = strlen(sts->host);
      if((subdomain && sts->includeSubDomains) && (ntail < hlen)) {
        size_t offs = hlen - ntail;
        if((hostname[offs-1] == '.') &&
           strncasecompare(&hostname[offs], sts->host, ntail) &&
           (ntail > blen)) {
          /* save the tail match with the longest tail */
          bestsub = sts;
          blen = ntail;
        }
      }
      /* avoid strcasecompare because the host name is not null terminated */
      if((hlen == ntail) && strncasecompare(hostname, sts->host, hlen))
        return sts;
    }
  }
  return bestsub;
}